

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_9::DiskHandle::clone
          (DiskHandle *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Fault f;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  do {
    iVar1 = fcntl64(*(undefined4 *)__fn,0x406,3);
    if (-1 < iVar1) {
      iVar2 = 0;
      break;
    }
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 == 0) {
    (this->fd).fd = iVar1;
  }
  else if ((iVar2 != 0x16) && (iVar2 != 0x5f)) {
    local_40.exception = (Exception *)0x0;
    local_38 = 0;
    uStack_30 = 0;
    kj::_::Debug::Fault::init
              (&local_40,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::~Fault(&local_40);
  }
  if (iVar2 != 0) {
    do {
      iVar1 = dup(*(int *)__fn);
      if (-1 < iVar1) {
        iVar2 = 0;
        break;
      }
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      local_40.exception = (Exception *)0x0;
      local_38 = 0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_40);
    }
    (this->fd).fd = iVar1;
    do {
      iVar2 = ioctl(iVar1,0x5451);
      if (-1 < iVar2) {
        iVar2 = 0;
        break;
      }
      uVar3 = kj::_::Debug::getOsErrorNumber(false);
      __fn = (__fn *)((ulong)__fn & 0xffffffff);
      if (uVar3 != 0xffffffff) {
        __fn = (__fn *)(ulong)uVar3;
      }
      iVar2 = (int)__fn;
    } while (uVar3 == 0xffffffff);
    if (iVar2 != 0) {
      if ((iVar2 != 0x16) && (iVar2 != 0x5f)) {
        local_40.exception = (Exception *)0x0;
        local_38 = 0;
        uStack_30 = 0;
        kj::_::Debug::Fault::init
                  (&local_40,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        kj::_::Debug::Fault::~Fault(&local_40);
      }
      do {
        uVar3 = fcntl64(iVar1,1);
        if (-1 < (int)uVar3) {
          iVar2 = 0;
          break;
        }
        iVar2 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        local_40.exception = (Exception *)0x0;
        local_38 = 0;
        uStack_30 = 0;
        kj::_::Debug::Fault::init
                  (&local_40,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_40);
      }
      if ((uVar3 & 1) == 0) {
        do {
          iVar2 = fcntl64(iVar1,2,uVar3 | 1);
          if (-1 < iVar2) {
            iVar2 = 0;
            break;
          }
          iVar2 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar2 == -1);
        if (iVar2 != 0) {
          local_40.exception = (Exception *)0x0;
          local_38 = 0;
          uStack_30 = 0;
          kj::_::Debug::Fault::init
                    (&local_40,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_40);
        }
      }
    }
  }
  return (int)this;
}

Assistant:

OwnFd clone() const {
#ifdef F_DUPFD_CLOEXEC
    int fd2;
    KJ_SYSCALL_HANDLE_ERRORS(fd2 = fcntl(fd, F_DUPFD_CLOEXEC, 3)) {
      case EINVAL:
      case EOPNOTSUPP:
        // fall back
        break;
      default:
        KJ_FAIL_SYSCALL("fnctl(fd, F_DUPFD_CLOEXEC, 3)", error) { break; }
        break;
    } else {
      return OwnFd(fd2);
    }
#endif

    auto result = KJ_SYSCALL_FD(::dup(fd));
    setCloexec(result);
    return result;
  }